

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlReaderNewFd(xmlTextReaderPtr reader,int fd,char *URL,char *encoding,int options)

{
  xmlParserInputBufferPtr input_00;
  xmlParserInputBufferPtr input;
  int options_local;
  char *encoding_local;
  char *URL_local;
  int fd_local;
  xmlTextReaderPtr reader_local;
  
  if (fd < 0) {
    reader_local._4_4_ = -1;
  }
  else if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else {
    input_00 = xmlParserInputBufferCreateFd(fd,XML_CHAR_ENCODING_NONE);
    if (input_00 == (xmlParserInputBufferPtr)0x0) {
      reader_local._4_4_ = -1;
    }
    else {
      input_00->closecallback = (xmlInputCloseCallback)0x0;
      reader_local._4_4_ = xmlTextReaderSetup(reader,input_00,URL,encoding,options);
    }
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlReaderNewFd(xmlTextReaderPtr reader, int fd,
               const char *URL, const char *encoding, int options)
{
    xmlParserInputBufferPtr input;

    if (fd < 0)
        return (-1);
    if (reader == NULL)
        return (-1);

    input = xmlParserInputBufferCreateFd(fd, XML_CHAR_ENCODING_NONE);
    if (input == NULL)
        return (-1);
    input->closecallback = NULL;
    return (xmlTextReaderSetup(reader, input, URL, encoding, options));
}